

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cComputeShaderTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::anon_unknown_0::BasicSharedSimple::RunIteration
          (BasicSharedSimple *this,GLuint num_groups,bool dispatch_indirect)

{
  ulong uVar1;
  reference pvVar2;
  uint local_64;
  GLuint local_60;
  GLuint i;
  GLuint groups [3];
  allocator<unsigned_int> local_45;
  value_type_conflict4 local_44;
  undefined1 local_40 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> data;
  GLuint kBufferSize;
  bool dispatch_indirect_local;
  GLuint num_groups_local;
  BasicSharedSimple *this_local;
  
  data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = num_groups << 8;
  uVar1 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  local_44 = 0xffff;
  std::allocator<unsigned_int>::allocator(&local_45);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,uVar1,&local_44,
             &local_45);
  std::allocator<unsigned_int>::~allocator(&local_45);
  if (this->m_storage_buffer == 0) {
    glu::CallLogWrapper::glGenBuffers
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,1,&this->m_storage_buffer);
  }
  glu::CallLogWrapper::glBindBufferBase
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,this->m_storage_buffer);
  uVar1 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  glu::CallLogWrapper::glBufferData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,uVar1 << 2,pvVar2,0x88e8);
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0);
  glu::CallLogWrapper::glUseProgram
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,this->m_program);
  if (dispatch_indirect) {
    i = 1;
    groups[0] = 1;
    local_60 = num_groups;
    if (this->m_dispatch_buffer == 0) {
      glu::CallLogWrapper::glGenBuffers
                (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                  super_CallLogWrapper,1,&this->m_dispatch_buffer);
    }
    glu::CallLogWrapper::glBindBuffer
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ee,this->m_dispatch_buffer);
    glu::CallLogWrapper::glBufferData
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0x90ee,0xc,&local_60,0x88e4);
    glu::CallLogWrapper::glDispatchComputeIndirect
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,0);
  }
  else {
    glu::CallLogWrapper::glDispatchCompute
              (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.
                super_CallLogWrapper,num_groups,1,1);
  }
  glu::CallLogWrapper::glBindBuffer
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,this->m_storage_buffer);
  glu::CallLogWrapper::glMemoryBarrier
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x200);
  uVar1 = (ulong)data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage._4_4_;
  pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,0);
  glu::CallLogWrapper::glGetBufferSubData
            (&(this->super_ComputeShaderBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper
             ,0x90d2,0,uVar1 << 2,pvVar2);
  local_64 = 0;
  do {
    if (data.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_ <= local_64) {
      this_local._7_1_ = true;
LAB_00f6419b:
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40);
      return this_local._7_1_;
    }
    pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                        (ulong)local_64);
    if (*pvVar2 != 1) {
      pvVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_40,
                          (ulong)local_64);
      anon_unknown_0::Output
                ("Data at index %d is %d should be %d.\n",(ulong)local_64,(ulong)*pvVar2,1);
      this_local._7_1_ = false;
      goto LAB_00f6419b;
    }
    local_64 = local_64 + 1;
  } while( true );
}

Assistant:

bool RunIteration(const GLuint num_groups, bool dispatch_indirect)
	{
		const GLuint kBufferSize = 256 * num_groups;

		std::vector<GLuint> data(kBufferSize, 0xffff);
		if (m_storage_buffer == 0)
			glGenBuffers(1, &m_storage_buffer);
		glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer);
		glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(GLuint) * kBufferSize, &data[0], GL_DYNAMIC_DRAW);
		glBindBuffer(GL_SHADER_STORAGE_BUFFER, 0);

		glUseProgram(m_program);
		if (dispatch_indirect)
		{
			const GLuint groups[3] = { num_groups, 1, 1 };
			if (m_dispatch_buffer == 0)
				glGenBuffers(1, &m_dispatch_buffer);
			glBindBuffer(GL_DISPATCH_INDIRECT_BUFFER, m_dispatch_buffer);
			glBufferData(GL_DISPATCH_INDIRECT_BUFFER, sizeof(groups), groups, GL_STATIC_DRAW);
			glDispatchComputeIndirect(0);
		}
		else
		{
			glDispatchCompute(num_groups, 1, 1);
		}

		glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer);
		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);
		glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(GLuint) * kBufferSize, &data[0]);
		for (GLuint i = 0; i < kBufferSize; ++i)
		{
			if (data[i] != 1)
			{
				Output("Data at index %d is %d should be %d.\n", i, data[i], 1);
				return false;
			}
		}
		return true;
	}